

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O0

void __thiscall
QDomEntityPrivate::save(QDomEntityPrivate *this,QTextStream *s,int param_3,int param_4)

{
  bool bVar1;
  ulong uVar2;
  QTextStream *pQVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  QTextStream *in_RSI;
  QByteArray *in_RDI;
  long in_FS_OFFSET;
  QString _name;
  QStringBuilder<QString,_QString> *in_stack_fffffffffffffea8;
  QStringBuilder<QString,_QString> *in_stack_fffffffffffffeb0;
  QString *in_stack_fffffffffffffeb8;
  size_t in_stack_fffffffffffffec0;
  QByteArray *str;
  undefined1 local_118 [24];
  undefined1 local_100 [24];
  undefined1 local_e8 [48];
  undefined1 local_b8 [24];
  undefined1 local_a0 [126];
  QChar local_22;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  str = in_RDI;
  QString::QString(&in_stack_fffffffffffffeb0->a,&in_stack_fffffffffffffea8->a);
  QChar::QChar<char16_t,_true>(&local_22,L'%');
  uVar2 = QString::startsWith((QChar)(char16_t)&local_20,(uint)(ushort)local_22.ucs);
  if ((uVar2 & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s((char16_t *)in_RDI,in_stack_fffffffffffffec0);
    QString::mid((longlong)local_a0,(longlong)&local_20);
    operator+(in_stack_fffffffffffffeb8,&in_stack_fffffffffffffeb0->a);
    QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffffea8);
    QString::operator=(&in_stack_fffffffffffffeb0->a,&in_stack_fffffffffffffea8->a);
    QString::~QString((QString *)0x1196c9);
    QStringBuilder<QString,_QString>::~QStringBuilder(in_stack_fffffffffffffeb0);
    QString::~QString((QString *)0x1196e3);
    QString::~QString((QString *)0x1196f0);
  }
  bVar1 = QString::isNull((QString *)0x119701);
  if ((bVar1) && (bVar1 = QString::isNull((QString *)0x11971b), bVar1)) {
    pQVar3 = (QTextStream *)QTextStream::operator<<(in_RSI,"<!ENTITY ");
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_20);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3," \"");
    QString::toUtf8(&in_stack_fffffffffffffea8->a);
    encodeEntity(str);
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QByteArray *)local_b8);
    QTextStream::operator<<(pQVar3,"\">");
    operator<<((QTextStream *)in_stack_fffffffffffffeb0,
               (QTextStreamFunction)in_stack_fffffffffffffea8);
    QByteArray::~QByteArray((QByteArray *)0x1197c1);
    QByteArray::~QByteArray((QByteArray *)0x1197ce);
  }
  else {
    pQVar3 = (QTextStream *)QTextStream::operator<<(in_RSI,"<!ENTITY ");
    pQVar3 = (QTextStream *)QTextStream::operator<<(pQVar3,(QString *)&local_20);
    QTextStream::operator<<(pQVar3,' ');
    bVar1 = QString::isNull((QString *)0x119812);
    if (bVar1) {
      pQVar3 = (QTextStream *)QTextStream::operator<<(in_RSI,"SYSTEM ");
      quotedValue((QString *)CONCAT44(in_EDX,in_ECX));
      QTextStream::operator<<(pQVar3,(QString *)local_e8);
      QString::~QString((QString *)0x11985d);
    }
    else {
      in_stack_fffffffffffffea8 =
           (QStringBuilder<QString,_QString> *)QTextStream::operator<<(in_RSI,"PUBLIC ");
      quotedValue((QString *)CONCAT44(in_EDX,in_ECX));
      pQVar3 = (QTextStream *)
               QTextStream::operator<<
                         ((QTextStream *)in_stack_fffffffffffffea8,(QString *)local_100);
      in_stack_fffffffffffffeb0 =
           (QStringBuilder<QString,_QString> *)QTextStream::operator<<(pQVar3,' ');
      quotedValue((QString *)CONCAT44(in_EDX,in_ECX));
      QTextStream::operator<<((QTextStream *)in_stack_fffffffffffffeb0,(QString *)local_118);
      QString::~QString((QString *)0x1198dc);
      QString::~QString((QString *)0x1198e6);
    }
    bVar1 = QString::isNull((QString *)0x1198f7);
    if (!bVar1) {
      pQVar3 = (QTextStream *)QTextStream::operator<<(in_RSI," NDATA ");
      QTextStream::operator<<(pQVar3,(QString *)(in_RDI + 9));
    }
    QTextStream::operator<<(in_RSI,'>');
    operator<<((QTextStream *)in_stack_fffffffffffffeb0,
               (QTextStreamFunction)in_stack_fffffffffffffea8);
  }
  QString::~QString((QString *)0x11994b);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDomEntityPrivate::save(QTextStream& s, int, int) const
{
    QString _name = name;
    if (_name.startsWith(u'%'))
        _name = u"% "_s + _name.mid(1);

    if (m_sys.isNull() && m_pub.isNull()) {
        s << "<!ENTITY " << _name << " \"" << encodeEntity(value.toUtf8()) << "\">" << Qt::endl;
    } else {
        s << "<!ENTITY " << _name << ' ';
        if (m_pub.isNull()) {
            s << "SYSTEM " << quotedValue(m_sys);
        } else {
            s << "PUBLIC " << quotedValue(m_pub) << ' ' << quotedValue(m_sys);
        }
        if (! m_notationName.isNull()) {
            s << " NDATA " << m_notationName;
        }
        s << '>' << Qt::endl;
    }
}